

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void area_echo(CHAR_DATA *ch,char *echo)

{
  ROOM_INDEX_DATA *pRVar1;
  DESCRIPTOR_DATA **ppDVar2;
  char buffer [9216];
  char acStack_2428 [9216];
  
  ppDVar2 = &descriptor_list;
  while (ppDVar2 = &((DESCRIPTOR_DATA *)ppDVar2)->next->next,
        (DESCRIPTOR_DATA *)ppDVar2 != (DESCRIPTOR_DATA *)0x0) {
    if (((DESCRIPTOR_DATA *)ppDVar2)->connected == 0) {
      pRVar1 = ((DESCRIPTOR_DATA *)ppDVar2)->character->in_room;
      if (((pRVar1 != (ROOM_INDEX_DATA *)0x0) && (ch->in_room != (ROOM_INDEX_DATA *)0x0)) &&
         (pRVar1->area == ch->in_room->area)) {
        colorconv(acStack_2428,echo,((DESCRIPTOR_DATA *)ppDVar2)->character);
        send_to_char(acStack_2428,((DESCRIPTOR_DATA *)ppDVar2)->character);
        send_to_char("\n\r",((DESCRIPTOR_DATA *)ppDVar2)->character);
      }
    }
  }
  return;
}

Assistant:

void area_echo(CHAR_DATA *ch, char *echo)
{
	char buffer[MAX_STRING_LENGTH * 2];

	for (DESCRIPTOR_DATA *d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character->in_room != nullptr
			&& ch->in_room != nullptr
			&& d->character->in_room->area == ch->in_room->area)
		{
			colorconv(buffer, echo, d->character);
			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}